

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void lyp_check_circmod_pop(ly_ctx *ctx)

{
  uint8_t uVar1;
  
  uVar1 = (ctx->models).parsing_sub_modules_count;
  if (uVar1 != '\0') {
    uVar1 = uVar1 + 0xff;
    (ctx->models).parsing_sub_modules_count = uVar1;
    if (uVar1 == '\0') {
      free((ctx->models).parsing_sub_modules);
      (ctx->models).parsing_sub_modules = (lys_module **)0x0;
    }
    return;
  }
  ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
         ,0xa95);
  return;
}

Assistant:

void
lyp_check_circmod_pop(struct ly_ctx *ctx)
{
    if (!ctx->models.parsing_sub_modules_count) {
        LOGINT(ctx);
        return;
    }

    /* update the list of currently being parsed modules */
    ctx->models.parsing_sub_modules_count--;
    if (!ctx->models.parsing_sub_modules_count) {
        free(ctx->models.parsing_sub_modules);
        ctx->models.parsing_sub_modules = NULL;
    }
}